

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O2

void __thiscall
Pl_RunLength::Pl_RunLength(Pl_RunLength *this,char *identifier,Pipeline *next,action_e action)

{
  logic_error *this_00;
  action_e action_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_RunLength_002ac720;
  std::make_unique<Pl_RunLength::Members,Pl_RunLength::action_e&>((action_e *)&this->m);
  if (next != (Pipeline *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Attempt to create Pl_RunLength with nullptr as next");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_RunLength::Pl_RunLength(char const* identifier, Pipeline* next, action_e action) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(action))
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_RunLength with nullptr as next");
    }
}